

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Performance::DepthTests::init(DepthTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestContext *testCtx;
  RenderContext *renderCtx;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  PartialOccluderDiscardCullCase *pPVar5;
  PartialOccluderCullCase *pPVar6;
  GradientCostCase *pGVar7;
  OccludingGeometryComplexityCostCase *pOVar8;
  char *pcVar9;
  int in_R9D;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  testCtx = pCVar1->m_testCtx;
  renderCtx = pCVar1->m_renderCtx;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "cull_efficiency","Fragment cull efficiency");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"workload",
             "Workload");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar4 = (TestNode *)operator_new(0xd8);
  Performance::anon_unknown_0::FragmentWorkloadCullCase::FragmentWorkloadCullCase
            ((FragmentWorkloadCullCase *)pTVar4,testCtx,renderCtx,"workload_texture",
             "Fragment shader with texture lookup workload");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__FragmentTextureWorkloadCullCase_01e4af98;
  pTVar4[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::FragmentWorkloadCullCase::FragmentWorkloadCullCase
            ((FragmentWorkloadCullCase *)pTVar4,testCtx,renderCtx,"workload_arithmetic",
             "Fragment shader with arithmetic workload");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b198;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::FragmentWorkloadCullCase::FragmentWorkloadCullCase
            ((FragmentWorkloadCullCase *)pTVar4,testCtx,renderCtx,"workload_arithmetic_discard",
             "Fragment shader that may discard with arithmetic workload");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b218;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "occluder_discard","Discard");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pPVar5 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar5,testCtx,renderCtx,"grid_256",(char *)0x100,in_R9D);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar5,testCtx,renderCtx,"grid_128",(char *)0x80,in_R9D);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar5,testCtx,renderCtx,"grid_64",(char *)0x40,in_R9D);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar5,testCtx,renderCtx,"grid_32",(char *)0x20,in_R9D);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar5,testCtx,renderCtx,"grid_16",(char *)0x10,in_R9D);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar5,testCtx,renderCtx,"grid_8",(char *)0x8,in_R9D);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar5,testCtx,renderCtx,"grid_4",&DAT_00000004,in_R9D);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar5,testCtx,renderCtx,"grid_2",(char *)0x2,in_R9D);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar5);
  pPVar5 = (PartialOccluderDiscardCullCase *)operator_new(0xd0);
  pcVar9 = &DAT_00000001;
  Performance::anon_unknown_0::PartialOccluderDiscardCullCase::PartialOccluderDiscardCullCase
            (pPVar5,testCtx,renderCtx,"grid_1",&DAT_00000001,in_R9D);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar5);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "partial_coverage","Partial Coverage");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pPVar6 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar6,testCtx,renderCtx,"100",pcVar9,1.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar6);
  pPVar6 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar6,testCtx,renderCtx,"099",pcVar9,0.99);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar6);
  pPVar6 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar6,testCtx,renderCtx,"095",pcVar9,0.95);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar6);
  pPVar6 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar6,testCtx,renderCtx,"090",pcVar9,0.9);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar6);
  pPVar6 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar6,testCtx,renderCtx,"080",pcVar9,0.8);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar6);
  pPVar6 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar6,testCtx,renderCtx,"070",pcVar9,0.7);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar6);
  pPVar6 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar6,testCtx,renderCtx,"050",pcVar9,0.5);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar6);
  pPVar6 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar6,testCtx,renderCtx,"025",pcVar9,0.25);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar6);
  pPVar6 = (PartialOccluderCullCase *)operator_new(0xd0);
  Performance::anon_unknown_0::PartialOccluderCullCase::PartialOccluderCullCase
            (pPVar6,testCtx,renderCtx,"010",pcVar9,0.1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar6);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"frag_depth",
             "Partial Coverage");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar4 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::RelativeChangeCase::RelativeChangeCase
            ((RelativeChangeCase *)pTVar4,testCtx,renderCtx,"occluder_static",
             glcts::fixed_sample_locations_values + 1);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b398;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::RelativeChangeCase::RelativeChangeCase
            ((RelativeChangeCase *)pTVar4,testCtx,renderCtx,"occluder_dynamic",
             glcts::fixed_sample_locations_values + 1);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b418;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::RelativeChangeCase::RelativeChangeCase
            ((RelativeChangeCase *)pTVar4,testCtx,renderCtx,"occluded_static",
             glcts::fixed_sample_locations_values + 1);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b498;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar4 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::RelativeChangeCase::RelativeChangeCase
            ((RelativeChangeCase *)pTVar4,testCtx,renderCtx,"occluded_dynamic",
             glcts::fixed_sample_locations_values + 1);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b518;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"order",
             "Rendering order");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = (TestNode *)operator_new(200);
  pcVar9 = "Back to front rendering order";
  Performance::anon_unknown_0::RelativeChangeCase::RelativeChangeCase
            ((RelativeChangeCase *)pTVar2,testCtx,renderCtx,"reversed",
             "Back to front rendering order");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b598;
  tcu::TestNode::addChild(pTVar3,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "culled_pixel_cost","Fragment cull efficiency");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"gradient",
             "Gradients with small depth differences");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar4 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::RenderCountCase::RenderCountCase
            ((RenderCountCase *)pTVar4,testCtx,renderCtx,"flat",pcVar9);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b618;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  pGVar7 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar7,testCtx,renderCtx,"gradient_050",pcVar9,0.5);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pGVar7);
  pGVar7 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar7,testCtx,renderCtx,"gradient_010",pcVar9,0.1);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pGVar7);
  pGVar7 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar7,testCtx,renderCtx,"gradient_005",pcVar9,0.05);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pGVar7);
  pGVar7 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar7,testCtx,renderCtx,"gradient_002",pcVar9,0.02);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pGVar7);
  pGVar7 = (GradientCostCase *)operator_new(0xd0);
  Performance::anon_unknown_0::GradientCostCase::GradientCostCase
            (pGVar7,testCtx,renderCtx,"gradient_001",pcVar9,0.01);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pGVar7);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "occluder_geometry","Occluders with varying geometry complexity");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_uniform_grid_5",(char *)0x5,in_R9D,0.0,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_uniform_grid_15",(char *)0xf,in_R9D,0.0,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_uniform_grid_25",(char *)0x19,in_R9D,0.0,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_uniform_grid_50",(char *)0x32,in_R9D,0.0,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_uniform_grid_100",(char *)0x64,in_R9D,0.0,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_noisy_grid_5",(char *)0x5,in_R9D,0.2,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_noisy_grid_15",(char *)0xf,in_R9D,0.06666667,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_noisy_grid_25",(char *)0x19,in_R9D,0.04,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_noisy_grid_50",(char *)0x32,in_R9D,0.02,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"flat_noisy_grid_100",(char *)0x64,in_R9D,0.01,0.0);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_uniform_grid_5",(char *)0x5,in_R9D,0.0,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_uniform_grid_15",(char *)0xf,in_R9D,0.0,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_uniform_grid_25",(char *)0x19,in_R9D,0.0,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_uniform_grid_50",(char *)0x32,in_R9D,0.0,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_uniform_grid_100",(char *)0x64,in_R9D,0.0,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_noisy_grid_5",(char *)0x5,in_R9D,0.2,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_noisy_grid_15",(char *)0xf,in_R9D,0.06666667,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_noisy_grid_25",(char *)0x19,in_R9D,0.04,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_noisy_grid_50",(char *)0x32,in_R9D,0.02,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pOVar8 = (OccludingGeometryComplexityCostCase *)operator_new(0xd8);
  pcVar9 = (char *)0x64;
  Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::
  OccludingGeometryComplexityCostCase
            (pOVar8,testCtx,renderCtx,"uneven_noisy_grid_100",(char *)0x64,in_R9D,0.01,0.2);
  tcu::TestNode::addChild(pTVar3,(TestNode *)pOVar8);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"frag_depth",
             "Modifying gl_FragDepth");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::RenderCountCase::RenderCountCase
            ((RenderCountCase *)pTVar2,testCtx,renderCtx,"occluder_static",pcVar9);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b818;
  tcu::TestNode::addChild(pTVar3,pTVar2);
  pTVar2 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::RenderCountCase::RenderCountCase
            ((RenderCountCase *)pTVar2,testCtx,renderCtx,"occluder_dynamic",pcVar9);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b898;
  tcu::TestNode::addChild(pTVar3,pTVar2);
  pTVar2 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::RenderCountCase::RenderCountCase
            ((RenderCountCase *)pTVar2,testCtx,renderCtx,"occluded_static",pcVar9);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b918;
  tcu::TestNode::addChild(pTVar3,pTVar2);
  pTVar2 = (TestNode *)operator_new(200);
  Performance::anon_unknown_0::RenderCountCase::RenderCountCase
            ((RenderCountCase *)pTVar2,testCtx,renderCtx,"occluded_dynamic",pcVar9);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__BaseCase_01e4b998;
  tcu::TestNode::addChild(pTVar3,pTVar2);
  return extraout_EAX;
}

Assistant:

void DepthTests::init (void)
{
	TestContext&			testCtx		= m_context.getTestContext();
	const RenderContext&	renderCtx	= m_context.getRenderContext();

	{
		tcu::TestCaseGroup* const cullEfficiencyGroup = new tcu::TestCaseGroup(m_testCtx, "cull_efficiency", "Fragment cull efficiency");

		addChild(cullEfficiencyGroup);

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "workload", "Workload");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new FragmentTextureWorkloadCullCase(			testCtx, renderCtx, "workload_texture",				"Fragment shader with texture lookup workload"));
			group->addChild(new FragmentArithmeticWorkloadCullCase(			testCtx, renderCtx, "workload_arithmetic",			"Fragment shader with arithmetic workload"));
			group->addChild(new FragmentDiscardArithmeticWorkloadCullCase(	testCtx, renderCtx, "workload_arithmetic_discard",	"Fragment shader that may discard with arithmetic workload"));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "occluder_discard", "Discard");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_256",	"Parts of occluder geometry discarded", 256));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_128",	"Parts of occluder geometry discarded", 128));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_64",	"Parts of occluder geometry discarded", 64));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_32",	"Parts of occluder geometry discarded", 32));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_16",	"Parts of occluder geometry discarded", 16));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_8",	"Parts of occluder geometry discarded", 8));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_4",	"Parts of occluder geometry discarded", 4));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_2",	"Parts of occluder geometry discarded", 2));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_1",	"Parts of occluder geometry discarded", 1));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "partial_coverage", "Partial Coverage");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "100", "Occluder covering only part of occluded geometry", 1.00f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "099", "Occluder covering only part of occluded geometry", 0.99f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "095", "Occluder covering only part of occluded geometry", 0.95f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "090", "Occluder covering only part of occluded geometry", 0.90f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "080", "Occluder covering only part of occluded geometry", 0.80f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "070", "Occluder covering only part of occluded geometry", 0.70f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "050", "Occluder covering only part of occluded geometry", 0.50f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "025", "Occluder covering only part of occluded geometry", 0.25f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "010", "Occluder covering only part of occluded geometry", 0.10f));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "frag_depth", "Partial Coverage");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new StaticOccluderFragDepthCullCase( testCtx, renderCtx, "occluder_static", ""));
			group->addChild(new DynamicOccluderFragDepthCullCase(testCtx, renderCtx, "occluder_dynamic", ""));
			group->addChild(new StaticOccludedFragDepthCullCase( testCtx, renderCtx, "occluded_static", ""));
			group->addChild(new DynamicOccludedFragDepthCullCase(testCtx, renderCtx, "occluded_dynamic", ""));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "order", "Rendering order");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new ReversedDepthOrderCullCase(testCtx, renderCtx, "reversed", "Back to front rendering order"));
		}
	}

	{
		tcu::TestCaseGroup* const testCostGroup = new tcu::TestCaseGroup(m_testCtx, "culled_pixel_cost", "Fragment cull efficiency");

		addChild(testCostGroup);

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "gradient", "Gradients with small depth differences");

			testCostGroup->addChild(group);

			group->addChild(new BaseCostCase(testCtx, renderCtx, "flat", ""));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_050", "", 0.50f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_010", "", 0.10f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_005", "", 0.05f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_002", "", 0.02f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_001", "", 0.01f));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "occluder_geometry", "Occluders with varying geometry complexity");

			testCostGroup->addChild(group);

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_5",   "", 5,   0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_15",  "", 15,  0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_25",  "", 25,  0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_50",  "", 50,  0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_100", "", 100, 0.0f, 0.0f));

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_5",   "", 5,   1.0f/5.0f,   0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_15",  "", 15,  1.0f/15.0f,  0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_25",  "", 25,  1.0f/25.0f,  0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_50",  "", 50,  1.0f/50.0f,  0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_100", "", 100, 1.0f/100.0f, 0.0f));

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_5",   "", 5,   0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_15",  "", 15,  0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_25",  "", 25,  0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_50",  "", 50,  0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_100", "", 100, 0.0f, 0.2f));

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_5",   "", 5,   1.0f/5.0f,   0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_15",  "", 15,  1.0f/15.0f,  0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_25",  "", 25,  1.0f/25.0f,  0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_50",  "", 50,  1.0f/50.0f,  0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_100", "", 100, 1.0f/100.0f, 0.2f));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "frag_depth", "Modifying gl_FragDepth");

			testCostGroup->addChild(group);

			group->addChild(new OccluderStaticFragDepthCostCase( testCtx, renderCtx, "occluder_static", ""));
			group->addChild(new OccluderDynamicFragDepthCostCase(testCtx, renderCtx, "occluder_dynamic", ""));
			group->addChild(new OccludedStaticFragDepthCostCase( testCtx, renderCtx, "occluded_static", ""));
			group->addChild(new OccludedDynamicFragDepthCostCase(testCtx, renderCtx, "occluded_dynamic", ""));
		}
	}
}